

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int run_container_intersection_cardinality(run_container_t *src_1,run_container_t *src_2)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  run_container_t *in_RSI;
  run_container_t *in_RDI;
  int32_t earliestend;
  int32_t lateststart;
  int32_t xend;
  int32_t xstart;
  int32_t end;
  int32_t start;
  int32_t xrlepos;
  int32_t rlepos;
  int answer;
  _Bool if2;
  _Bool if1;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  _Var2 = run_container_is_full(in_RDI);
  _Var3 = run_container_is_full(in_RSI);
  if ((_Var2) || (_Var3)) {
    if (_Var2) {
      iVar4 = run_container_cardinality
                        ((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      return iVar4;
    }
    if (_Var3) {
      iVar4 = run_container_cardinality
                        ((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      return iVar4;
    }
  }
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = (uint)in_RDI->runs->value;
  local_30 = local_2c + in_RDI->runs->length + 1;
  local_34 = (uint)in_RSI->runs->value;
  local_38 = local_34 + in_RSI->runs->length + 1;
  while( true ) {
    bVar1 = false;
    if (local_24 < in_RDI->n_runs) {
      bVar1 = local_28 < in_RSI->n_runs;
    }
    if (!bVar1) break;
    if (local_34 < local_30) {
      if (local_2c < local_38) {
        uVar5 = local_34;
        if (local_34 < local_2c) {
          uVar5 = local_2c;
        }
        if (local_30 == local_38) {
          local_40 = local_30;
          local_24 = local_24 + 1;
          local_28 = local_28 + 1;
          if (local_24 < in_RDI->n_runs) {
            local_2c = (uint)in_RDI->runs[local_24].value;
            local_30 = local_2c + in_RDI->runs[local_24].length + 1;
          }
          if (local_28 < in_RSI->n_runs) {
            local_34 = (uint)in_RSI->runs[local_28].value;
            local_38 = local_34 + in_RSI->runs[local_28].length + 1;
          }
        }
        else if (local_30 < local_38) {
          local_40 = local_30;
          local_24 = local_24 + 1;
          if (local_24 < in_RDI->n_runs) {
            local_2c = (uint)in_RDI->runs[local_24].value;
            local_30 = local_2c + in_RDI->runs[local_24].length + 1;
          }
        }
        else {
          local_40 = local_38;
          local_28 = local_28 + 1;
          if (local_28 < in_RSI->n_runs) {
            local_34 = (uint)in_RSI->runs[local_28].value;
            local_38 = local_34 + in_RSI->runs[local_28].length + 1;
          }
        }
        local_20 = (local_40 - uVar5) + local_20;
      }
      else {
        local_28 = local_28 + 1;
        if (local_28 < in_RSI->n_runs) {
          local_34 = (uint)in_RSI->runs[local_28].value;
          local_38 = local_34 + in_RSI->runs[local_28].length + 1;
        }
      }
    }
    else {
      local_24 = local_24 + 1;
      if (local_24 < in_RDI->n_runs) {
        local_2c = (uint)in_RDI->runs[local_24].value;
        local_30 = local_2c + in_RDI->runs[local_24].length + 1;
      }
    }
  }
  return local_20;
}

Assistant:

int run_container_intersection_cardinality(const run_container_t *src_1,
                                           const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return run_container_cardinality(src_2);
        }
        if (if2) {
            return run_container_cardinality(src_1);
        }
    }
    int answer = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            answer += earliestend - lateststart;
        }
    }
    return answer;
}